

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash_test.cpp
# Opt level: O0

pint p_test_case_sha3_224_test(void)

{
  pint pVar1;
  puchar local_78 [8];
  puchar hash_etalon_3 [28];
  puchar hash_etalon_2 [28];
  puchar hash_etalon_1 [28];
  
  p_test_module_fail_counter = 0;
  stack0xffffffffffffffc8 = 0x4af28c3f4c8242e6;
  stack0xffffffffffffffa8 = 0x21da4a158b10248a;
  hash_etalon_2[0] = 0xc9;
  hash_etalon_2[1] = 0xfd;
  hash_etalon_2[2] = 'U';
  hash_etalon_2[3] = 't';
  hash_etalon_2[4] = 'I';
  hash_etalon_2[5] = 'D';
  hash_etalon_2[6] = 'y';
  hash_etalon_2[7] = 0xba;
  hash_etalon_2[8] = '\\';
  hash_etalon_2[9] = '~';
  hash_etalon_2[10] = 'z';
  hash_etalon_2[0xb] = 0xb7;
  hash_etalon_2[0xc] = 'n';
  hash_etalon_2[0xd] = 0xf2;
  hash_etalon_2[0xe] = 'd';
  hash_etalon_2[0xf] = 0xea;
  hash_etalon_2[0x10] = 0xd0;
  hash_etalon_2[0x11] = 0xfc;
  hash_etalon_2[0x12] = 0xce;
  hash_etalon_2[0x13] = '3';
  local_78[0] = 0xd6;
  local_78[1] = 0x93;
  local_78[2] = '5';
  local_78[3] = 0xb9;
  local_78[4] = '3';
  local_78[5] = '%';
  local_78[6] = '\x19';
  local_78[7] = '.';
  hash_etalon_3[0] = 'Q';
  hash_etalon_3[1] = 'j';
  hash_etalon_3[2] = 0x91;
  hash_etalon_3[3] = '.';
  hash_etalon_3[4] = 'm';
  hash_etalon_3[5] = '\x19';
  hash_etalon_3[6] = 0xa1;
  hash_etalon_3[7] = '\\';
  hash_etalon_3[8] = 0xb5;
  hash_etalon_3[9] = '\x1c';
  hash_etalon_3[10] = 'n';
  hash_etalon_3[0xb] = 0xd5;
  hash_etalon_3[0xc] = 0xc1;
  hash_etalon_3[0xd] = 'R';
  hash_etalon_3[0xe] = 'C';
  hash_etalon_3[0xf] = 0xe7;
  hash_etalon_3[0x10] = 0xa7;
  hash_etalon_3[0x11] = 0xfd;
  hash_etalon_3[0x12] = 'e';
  hash_etalon_3[0x13] = '<';
  p_libsys_init();
  general_hash_test(P_CRYPTO_HASH_TYPE_SHA3_224,0x1c,"abc",
                    "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",hash_etalon_2 + 0x18,
                    hash_etalon_3 + 0x18,local_78,
                    "e642824c3f8cf24ad09234ee7d3c766fc9a3a5168d0c94ad73b46fdf",
                    "8a24108b154ada21c9fd5574494479ba5c7e7ab76ef264ead0fcce33",
                    "d69335b93325192e516a912e6d19a15cb51c6ed5c15243e7a7fd653c",
                    "425fbad801bf675651dcf61af1138831480b562e714c70a2a0050ad3");
  p_libsys_shutdown();
  pVar1 = -1;
  if (p_test_module_fail_counter == 0) {
    pVar1 = 0;
  }
  return pVar1;
}

Assistant:

P_TEST_CASE_BEGIN (sha3_224_test)
{
	const puchar	hash_etalon_1[] = {230,  66, 130,  76,  63, 140, 242,  74, 208, 146,
					    52, 238, 125,  60, 118, 111, 201, 163, 165,  22,
					   141,  12, 148, 173, 115, 180, 111, 223};
	const puchar	hash_etalon_2[] = {138,  36,  16, 139,  21,  74, 218,  33, 201, 253,
					    85, 116,  73,  68, 121, 186,  92, 126, 122, 183,
					   110, 242, 100, 234, 208, 252, 206,  51};
	const puchar	hash_etalon_3[] = {214, 147,  53, 185,  51,  37,  25,  46,  81, 106,
					   145,  46, 109,  25, 161,  92, 181,  28, 110, 213,
					   193,  82,  67, 231, 167, 253, 101,  60};

	p_libsys_init ();

	general_hash_test (P_CRYPTO_HASH_TYPE_SHA3_224,
			   28,
			   "abc",
			   "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
			   hash_etalon_1,
			   hash_etalon_2,
			   hash_etalon_3,
			   "e642824c3f8cf24ad09234ee7d3c766fc9a3a5168d0c94ad73b46fdf",
			   "8a24108b154ada21c9fd5574494479ba5c7e7ab76ef264ead0fcce33",
			   "d69335b93325192e516a912e6d19a15cb51c6ed5c15243e7a7fd653c",
			   "425fbad801bf675651dcf61af1138831480b562e714c70a2a0050ad3");

	p_libsys_shutdown ();
}